

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O1

void trim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  pointer pcVar8;
  char *pcVar9;
  pointer pcVar10;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar3;
  pcVar7 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    pcVar7 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar3 >> 2) + 1;
    pcVar9 = pcVar2 + 3;
    do {
      iVar5 = isspace((int)pcVar9[-3]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -3;
        goto LAB_00140e63;
      }
      iVar5 = isspace((int)pcVar9[-2]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -2;
        goto LAB_00140e63;
      }
      iVar5 = isspace((int)pcVar9[-1]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -1;
        goto LAB_00140e63;
      }
      iVar5 = isspace((int)*pcVar9);
      if (iVar5 == 0) goto LAB_00140e63;
      lVar6 = lVar6 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar1 - (long)pcVar7;
  if (lVar6 == 1) {
LAB_00140e3f:
    iVar5 = isspace((int)*pcVar7);
    pcVar9 = pcVar7;
    if (iVar5 != 0) {
      pcVar9 = pcVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00140e2e:
    iVar5 = isspace((int)*pcVar7);
    pcVar9 = pcVar7;
    if (iVar5 != 0) {
      pcVar7 = pcVar7 + 1;
      goto LAB_00140e3f;
    }
  }
  else {
    pcVar9 = pcVar1;
    if ((lVar6 == 3) && (iVar5 = isspace((int)*pcVar7), pcVar9 = pcVar7, iVar5 != 0)) {
      pcVar7 = pcVar7 + 1;
      goto LAB_00140e2e;
    }
  }
LAB_00140e63:
  if (pcVar1 == pcVar9) {
    s->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  pcVar4 = (s->_M_dataplus)._M_p;
  pcVar10 = pcVar4 + s->_M_string_length;
  lVar6 = (long)s->_M_string_length >> 2;
  pcVar8 = pcVar10;
  if (0 < lVar6) {
    pcVar8 = pcVar10 + lVar6 * -4;
    lVar6 = lVar6 + 1;
    do {
      iVar5 = isspace((int)pcVar10[-1]);
      if (iVar5 == 0) goto LAB_00140f58;
      iVar5 = isspace((int)pcVar10[-2]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00140f58;
      }
      iVar5 = isspace((int)pcVar10[-3]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00140f58;
      }
      iVar5 = isspace((int)pcVar10[-4]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00140f58;
      }
      pcVar10 = pcVar10 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar8 - (long)pcVar4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pcVar10 = pcVar4;
      if ((lVar6 != 3) || (iVar5 = isspace((int)pcVar8[-1]), pcVar10 = pcVar8, iVar5 == 0))
      goto LAB_00140f58;
      pcVar8 = pcVar8 + -1;
    }
    iVar5 = isspace((int)pcVar8[-1]);
    pcVar10 = pcVar8;
    if (iVar5 == 0) goto LAB_00140f58;
    pcVar8 = pcVar8 + -1;
  }
  iVar5 = isspace((int)pcVar8[-1]);
  pcVar10 = pcVar8;
  if (iVar5 != 0) {
    pcVar10 = pcVar4;
  }
LAB_00140f58:
  s->_M_string_length = (long)pcVar10 - (long)pcVar4;
  *pcVar10 = '\0';
  return;
}

Assistant:

static inline void trim(std::string* s)
{
    trim(*s);
}